

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

float L3_pow_43(int x)

{
  int iVar1;
  float fVar2;
  int mult;
  int sign;
  float frac;
  int x_local;
  float local_4;
  
  mult = 0x100;
  if (x < 0x81) {
    local_4 = g_pow43[x + 0x10];
  }
  else {
    x_local = x;
    if (x < 0x400) {
      mult = 0x10;
      x_local = x << 3;
    }
    iVar1 = (x_local & 0x20U) * 2;
    fVar2 = (float)(int)((x_local & 0x3fU) + (x_local & 0x20U) * -2) /
            (float)(int)((x_local & 0xffffffc0U) + iVar1);
    local_4 = g_pow43[(x_local + iVar1 >> 6) + 0x10] *
              (fVar2 * (fVar2 * 0.22222222 + 1.3333334) + 1.0) * (float)mult;
  }
  return local_4;
}

Assistant:

static float L3_pow_43(int x)
{
    float frac;
    int sign, mult = 256;

    if (x < 129)
    {
        return g_pow43[16 + x];
    }

    if (x < 1024)
    {
        mult = 16;
        x <<= 3;
    }

    sign = 2*x & 64;
    frac = (float)((x & 63) - sign) / ((x & ~63) + sign);
    return g_pow43[16 + ((x + sign) >> 6)]*(1.f + frac*((4.f/3) + frac*(2.f/9)))*mult;
}